

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

void opj_tcd_destroy(opj_tcd_t *tcd)

{
  uint uVar1;
  opj_tcd_tile_t *poVar2;
  uint uVar3;
  code *pcVar4;
  opj_tcd_resolution_t *ptr;
  opj_tcd_image_t *ptr_00;
  uint uVar5;
  opj_tcd_precinct_t *ptr_01;
  opj_tcd_band_t *poVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  opj_tcd_tilecomp_t *ptr_02;
  
  if (tcd != (opj_tcd_t *)0x0) {
    ptr_00 = tcd->tcd_image;
    if (ptr_00 != (opj_tcd_image_t *)0x0) {
      pcVar4 = opj_tcd_code_block_dec_deallocate;
      if ((tcd->field_0x3c & 1) == 0) {
        pcVar4 = opj_tcd_code_block_enc_deallocate;
      }
      poVar2 = ptr_00->tiles;
      if (poVar2 != (opj_tcd_tile_t *)0x0) {
        ptr_02 = poVar2->comps;
        if (poVar2->numcomps != 0) {
          uVar5 = 0;
          do {
            ptr = ptr_02->resolutions;
            if (ptr != (opj_tcd_resolution_t *)0x0) {
              uVar1 = ptr_02->resolutions_size;
              if (0xbf < uVar1) {
                uVar3 = 0;
                do {
                  poVar6 = ptr->bands;
                  iVar9 = 0;
                  do {
                    ptr_01 = poVar6->precincts;
                    if (ptr_01 != (opj_tcd_precinct_t *)0x0) {
                      if (0x37 < poVar6->precincts_data_size) {
                        uVar8 = (ulong)(poVar6->precincts_data_size >> 3) / 7;
                        do {
                          opj_tgt_destroy(ptr_01->incltree);
                          ptr_01->incltree = (opj_tgt_tree_t *)0x0;
                          opj_tgt_destroy(ptr_01->imsbtree);
                          ptr_01->imsbtree = (opj_tgt_tree_t *)0x0;
                          (*pcVar4)(ptr_01);
                          ptr_01 = ptr_01 + 1;
                          uVar7 = (int)uVar8 - 1;
                          uVar8 = (ulong)uVar7;
                        } while (uVar7 != 0);
                        ptr_01 = poVar6->precincts;
                      }
                      opj_free(ptr_01);
                      poVar6->precincts = (opj_tcd_precinct_t *)0x0;
                    }
                    poVar6 = poVar6 + 1;
                    iVar9 = iVar9 + 1;
                  } while (iVar9 != 3);
                  ptr = ptr + 1;
                  uVar3 = uVar3 + 1;
                } while (uVar3 != uVar1 / 0xc0);
                ptr = ptr_02->resolutions;
              }
              opj_free(ptr);
              ptr_02->resolutions = (opj_tcd_resolution_t *)0x0;
            }
            if ((ptr_02->ownsData != 0) && (ptr_02->data != (OPJ_INT32 *)0x0)) {
              opj_image_data_free(ptr_02->data);
              ptr_02->data = (OPJ_INT32 *)0x0;
              ptr_02->ownsData = 0;
              ptr_02->data_size_needed = 0;
              ptr_02->data_size = 0;
            }
            opj_image_data_free(ptr_02->data_win);
            ptr_02 = ptr_02 + 1;
            uVar5 = uVar5 + 1;
          } while (uVar5 < poVar2->numcomps);
          ptr_02 = poVar2->comps;
        }
        opj_free(ptr_02);
        poVar2->comps = (opj_tcd_tilecomp_t *)0x0;
        opj_free(tcd->tcd_image->tiles);
        ptr_00 = tcd->tcd_image;
        ptr_00->tiles = (opj_tcd_tile_t *)0x0;
      }
      opj_free(ptr_00);
      tcd->tcd_image = (opj_tcd_image_t *)0x0;
    }
    opj_free(tcd->used_component);
    opj_free(tcd);
    return;
  }
  return;
}

Assistant:

void opj_tcd_destroy(opj_tcd_t *tcd)
{
    if (tcd) {
        opj_tcd_free_tile(tcd);

        if (tcd->tcd_image) {
            opj_free(tcd->tcd_image);
            tcd->tcd_image = 00;
        }

        opj_free(tcd->used_component);

        opj_free(tcd);
    }
}